

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSSOCase2::Run(BasicSSOCase2 *this)

{
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int height;
  byte local_91;
  Vector<float,_3> local_80;
  GLuint local_74;
  char *pcStack_70;
  GLuint sh;
  char *glsl_c;
  char *glsl_b;
  char *glsl_a;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  BasicSSOCase2 *pBStack_18;
  GLint res;
  BasicSSOCase2 *this_local;
  
  pBStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d6,&local_1c);
  if (local_1c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0",&local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (BasicSSOCase2 *)0x0;
  }
  else {
    glsl_b = 
    "#version 430 core\nlayout(binding = 1, std430) buffer Input {\n  vec2 g_input[4];\n};\nout StageData {\n  vec3 color;\n} g_vs_out;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  gl_Position = vec4(g_input[gl_VertexID], 0, 1);\n  g_vs_out.color = vec3(0, 1, 0);\n}"
    ;
    glsl_c = 
    "#version 430 core\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(g_fs_in.color, 1);\n}"
    ;
    pcStack_70 = 
    "#version 430 core\nlayout(local_size_x = 4) in;\nlayout(binding = 1, std430) buffer Output {\n  vec2 g_output[gl_WorkGroupSize.x];\n};\nvoid main() {\n  if (gl_GlobalInvocationID.x == 0) {\n    g_output[0] = vec2(-0.8, -0.8);\n  } else if (gl_GlobalInvocationID.x == 1) {\n    g_output[1] = vec2(0.8, -0.8);\n  } else if (gl_GlobalInvocationID.x == 2) {\n    g_output[2] = vec2(-0.8, 0.8);\n  } else if (gl_GlobalInvocationID.x == 3) {\n    g_output[3] = vec2(0.8, 0.8);\n  }\n}"
    ;
    GVar2 = glu::CallLogWrapper::glCreateProgram
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    this->m_program_ab = GVar2;
    local_74 = glu::CallLogWrapper::glCreateShader
                         (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8b31);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program_ab,local_74);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74,1,&glsl_b,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74);
    local_74 = glu::CallLogWrapper::glCreateShader
                         (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program_ab,local_74);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74,1,&glsl_c,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_74);
    glu::CallLogWrapper::glProgramParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program_ab,0x8258,1);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program_ab);
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x91b9,1,&stack0xffffffffffffff90);
    this->m_program_c = GVar2;
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_vao);
    glu::CallLogWrapper::glGenProgramPipelines
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_pipeline);
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_pipeline,0xffffffff,this->m_program_ab);
    glu::CallLogWrapper::glUseProgramStages
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_pipeline,0x20,this->m_program_c);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0x30,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glClear
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glBindProgramPipeline
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_pipeline);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x2000);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4);
    iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
    local_91 = 0;
    if (iVar3 < 500) {
      iVar3 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
      height = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
      tcu::Vector<float,_3>::Vector(&local_80,0.0,1.0,0.0);
      bVar1 = ComputeShaderBase::ValidateReadBufferCenteredQuad
                        (&this->super_ComputeShaderBase,iVar3,height,&local_80);
      local_91 = bVar1 ^ 0xff;
    }
    if ((local_91 & 1) == 0) {
      this_local = (BasicSSOCase2 *)0x0;
    }
    else {
      this_local = (BasicSSOCase2 *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_a =
			"#version 430 core" NL "layout(binding = 1, std430) buffer Input {" NL "  vec2 g_input[4];" NL "};" NL
			"out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL
			"};" NL "void main() {" NL "  gl_Position = vec4(g_input[gl_VertexID], 0, 1);" NL
			"  g_vs_out.color = vec3(0, 1, 0);" NL "}";

		const char* const glsl_b =
			"#version 430 core" NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL
			"layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(g_fs_in.color, 1);" NL "}";

		const char* const glsl_c =
			"#version 430 core" NL "layout(local_size_x = 4) in;" NL "layout(binding = 1, std430) buffer Output {" NL
			"  vec2 g_output[gl_WorkGroupSize.x];" NL "};" NL "void main() {" NL
			"  if (gl_GlobalInvocationID.x == 0) {" NL "    g_output[0] = vec2(-0.8, -0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 1) {" NL "    g_output[1] = vec2(0.8, -0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 2) {" NL "    g_output[2] = vec2(-0.8, 0.8);" NL
			"  } else if (gl_GlobalInvocationID.x == 3) {" NL "    g_output[3] = vec2(0.8, 0.8);" NL "  }" NL "}";

		m_program_ab = glCreateProgram();
		GLuint sh	= glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(m_program_ab, sh);
		glDeleteShader(sh);
		glShaderSource(sh, 1, &glsl_a, NULL);
		glCompileShader(sh);

		sh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(m_program_ab, sh);
		glDeleteShader(sh);
		glShaderSource(sh, 1, &glsl_b, NULL);
		glCompileShader(sh);

		glProgramParameteri(m_program_ab, GL_PROGRAM_SEPARABLE, GL_TRUE);
		glLinkProgram(m_program_ab);

		m_program_c = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_c);
		glGenVertexArrays(1, &m_vao);
		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_ALL_SHADER_BITS, m_program_ab);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program_c);

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec2) * 4, NULL, GL_STREAM_DRAW);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_pipeline);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (getWindowWidth() < 500 &&
			!ValidateReadBufferCenteredQuad(getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}